

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

int __thiscall
kj::CapabilityStreamNetworkAddress::connect
          (CapabilityStreamNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  PromiseNode *pPVar2;
  PromiseNode *pPVar3;
  TransformPromiseNodeBase *this_00;
  long lVar4;
  undefined4 in_register_00000034;
  CapabilityPipe pipe;
  Own<kj::_::PromiseNode> local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  long *plStack_50;
  Disposer *local_48;
  PromiseNode *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  long *plStack_30;
  
  (**(code **)(**(long **)(CONCAT44(in_register_00000034,__fd) + 8) + 0x10))(&local_48);
  pPVar3 = local_40;
  local_40 = (PromiseNode *)0x0;
  local_58 = local_38;
  uStack_54 = uStack_34;
  plStack_50 = plStack_30;
  plStack_30 = (long *)0x0;
  (**(code **)(**(long **)(CONCAT44(in_register_00000034,__fd) + 0x10) + 0x58))(&local_68);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_68,
             CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
             ::operator()<>);
  pPVar2 = local_68.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0064fe80;
  this_00[1].dependency.disposer = local_48;
  this_00[1].dependency.ptr = pPVar3;
  (this->super_NetworkAddress)._vptr_NetworkAddress =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::_::Void,kj::CaptureByMove<kj::CapabilityStreamNetworkAddress::connect()::$_0,kj::Own<kj::AsyncCapabilityStream>>,kj::_::PropagateException>>
        ::instance;
  this->provider = (AsyncIoProvider *)this_00;
  if (local_68.ptr != (PromiseNode *)0x0) {
    local_68.ptr = (PromiseNode *)0x0;
    (**(local_68.disposer)->_vptr_Disposer)
              (local_68.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  plVar1 = plStack_50;
  if (plStack_50 != (long *)0x0) {
    plStack_50 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_54,local_58))
              ((undefined8 *)CONCAT44(uStack_54,local_58),(long)plVar1 + *(long *)(*plVar1 + -0x10))
    ;
  }
  lVar4 = 0x10;
  do {
    plVar1 = *(long **)((long)&local_40 + lVar4);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)&local_40 + lVar4) = 0;
      (**(code **)**(undefined8 **)((long)&local_48 + lVar4))
                (*(undefined8 **)((long)&local_48 + lVar4),(long)plVar1 + *(long *)(*plVar1 + -0x10)
                );
    }
    lVar4 = lVar4 + -0x10;
  } while (lVar4 != -0x10);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamNetworkAddress::connect() {
  auto pipe = provider.newCapabilityPipe();
  auto result = kj::mv(pipe.ends[0]);
  return inner.sendStream(kj::mv(pipe.ends[1]))
      .then(kj::mvCapture(result, [](Own<AsyncIoStream>&& result) {
    return kj::mv(result);
  }));
}